

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.c
# Opt level: O0

lookahead_ctx *
av1_lookahead_init(uint width,uint height,uint subsampling_x,uint subsampling_y,int use_highbitdepth
                  ,uint depth,int border_in_pixels,int byte_alignment,int num_lap_buffers,
                  _Bool is_all_intra,_Bool alloc_pyramid)

{
  int iVar1;
  uint uVar2;
  lookahead_entry *plVar3;
  int in_R9D;
  bool bVar4;
  undefined4 in_stack_00000010;
  int in_stack_00000018;
  byte in_stack_00000020;
  uint i;
  lookahead_ctx *ctx;
  _Bool in_stack_00000063;
  int in_stack_00000064;
  uint8_t max_pre_frames;
  int lag_in_frames;
  undefined2 in_stack_0000006c;
  int in_stack_000000c0;
  int in_stack_000000c8;
  aom_codec_frame_buffer_t *in_stack_000000d0;
  aom_get_frame_buffer_cb_fn_t in_stack_000000d8;
  void *in_stack_000000e0;
  int in_stack_000000f0;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_54;
  uint local_44;
  lookahead_ctx *local_10;
  
  _in_stack_0000006c = CONCAT13(is_all_intra,CONCAT12(alloc_pyramid,in_stack_0000006c));
  local_54 = in_R9D;
  if (in_R9D == 0) {
    local_54 = 1;
  }
  bVar4 = (in_stack_00000020 & 1) == 0;
  iVar1 = clamp(in_stack_00000018 + in_R9D,1,0x60);
  uVar2 = (uint)bVar4 + iVar1;
  local_10 = (lookahead_ctx *)calloc(1,0x38);
  if (local_10 != (lookahead_ctx *)0x0) {
    local_10->max_sz = uVar2;
    local_10->push_frame_count = 0;
    local_10->max_pre_frames = bVar4;
    local_10->read_ctxs[0].pop_sz = local_10->max_sz - (uint)local_10->max_pre_frames;
    local_10->read_ctxs[0].valid = 1;
    if (in_stack_00000018 != 0) {
      local_10->read_ctxs[1].pop_sz = local_54;
      local_10->read_ctxs[1].valid = 1;
    }
    plVar3 = (lookahead_entry *)calloc((ulong)uVar2,0xf0);
    local_10->buf = plVar3;
    if (local_10->buf == (lookahead_entry *)0x0) {
LAB_00269156:
      av1_lookahead_destroy
                ((lookahead_ctx *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      local_10 = (lookahead_ctx *)0x0;
    }
    else {
      for (local_44 = 0; local_44 < uVar2; local_44 = local_44 + 1) {
        in_stack_ffffffffffffff70 = in_stack_00000010;
        iVar1 = aom_realloc_frame_buffer
                          ((YV12_BUFFER_CONFIG *)CONCAT44(subsampling_x,subsampling_y),
                           use_highbitdepth,depth,_in_stack_0000006c,lag_in_frames,in_stack_00000064
                           ,in_stack_000000c0,in_stack_000000c8,in_stack_000000d0,in_stack_000000d8,
                           in_stack_000000e0,in_stack_00000063,in_stack_000000f0);
        if (iVar1 != 0) goto LAB_00269156;
      }
    }
  }
  return local_10;
}

Assistant:

struct lookahead_ctx *av1_lookahead_init(
    unsigned int width, unsigned int height, unsigned int subsampling_x,
    unsigned int subsampling_y, int use_highbitdepth, unsigned int depth,
    const int border_in_pixels, int byte_alignment, int num_lap_buffers,
    bool is_all_intra, bool alloc_pyramid) {
  int lag_in_frames = AOMMAX(1, depth);

  // For all-intra frame encoding, previous source frames are not required.
  // Hence max_pre_frames is set to 0 in this case. As previous source frames
  // are accessed using a negative index to av1_lookahead_peek(), setting
  // max_pre_frames to 0 will cause av1_lookahead_peek() to return NULL for a
  // negative index.
  const uint8_t max_pre_frames = is_all_intra ? 0 : MAX_PRE_FRAMES;

  // Add the lags to depth and clamp
  depth += num_lap_buffers;
  depth = clamp(depth, 1, MAX_TOTAL_BUFFERS);

  // Allocate memory to keep previous source frames available.
  depth += max_pre_frames;

  // Allocate the lookahead structures
  struct lookahead_ctx *ctx = calloc(1, sizeof(*ctx));
  if (ctx) {
    unsigned int i;
    ctx->max_sz = depth;
    ctx->push_frame_count = 0;
    ctx->max_pre_frames = max_pre_frames;
    ctx->read_ctxs[ENCODE_STAGE].pop_sz = ctx->max_sz - ctx->max_pre_frames;
    ctx->read_ctxs[ENCODE_STAGE].valid = 1;
    if (num_lap_buffers) {
      ctx->read_ctxs[LAP_STAGE].pop_sz = lag_in_frames;
      ctx->read_ctxs[LAP_STAGE].valid = 1;
    }
    ctx->buf = calloc(depth, sizeof(*ctx->buf));
    if (!ctx->buf) goto fail;
    for (i = 0; i < depth; i++) {
      if (aom_realloc_frame_buffer(
              &ctx->buf[i].img, width, height, subsampling_x, subsampling_y,
              use_highbitdepth, border_in_pixels, byte_alignment, NULL, NULL,
              NULL, alloc_pyramid, 0)) {
        goto fail;
      }
    }
  }
  return ctx;
fail:
  av1_lookahead_destroy(ctx);
  return NULL;
}